

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

LY_ERR ly_time_time2str(time_t time,char *fractions_s,char **str)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  tm *ptVar4;
  LY_ERR LVar5;
  char *pcVar6;
  time_t unaff_R15;
  time_t time_local;
  tm tm;
  char zoneshift [12];
  
  time_local = time;
  if (str == (char **)0x0) {
    LVar5 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","str","ly_time_time2str");
  }
  else {
    tzset();
    ptVar4 = localtime_r(&time_local,(tm *)&tm);
    if (ptVar4 == (tm *)0x0) {
      LVar5 = LY_ESYS;
    }
    else {
      iVar2 = ly_time_tz_offset_at(unaff_R15);
      uVar3 = (iVar2 / 0x3c) % 0x3c;
      uVar1 = -uVar3;
      if (0 < (int)uVar3) {
        uVar1 = uVar3;
      }
      sprintf(zoneshift,"%+03d:%02d",(ulong)(uint)(iVar2 / 0xe10),(ulong)uVar1);
      pcVar6 = ".";
      if (fractions_s == (char *)0x0) {
        pcVar6 = "";
        fractions_s = "";
      }
      iVar2 = asprintf(str,"%04d-%02d-%02dT%02d:%02d:%02d%s%s%s",(ulong)(tm.tm_year + 0x76c),
                       (ulong)(tm.tm_mon + 1),(ulong)(uint)tm.tm_mday,(ulong)(uint)tm.tm_hour,
                       (ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,pcVar6,fractions_s,zoneshift);
      LVar5 = (LY_ERR)(iVar2 == -1);
    }
  }
  return LVar5;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_time_time2str(time_t time, const char *fractions_s, char **str)
{
    struct tm tm;
    char zoneshift[12];
    int zonediff_s, zonediff_h, zonediff_m;

    LY_CHECK_ARG_RET(NULL, str, LY_EINVAL);

    /* init timezone */
    tzset();

    /* convert */
    if (!localtime_r(&time, &tm)) {
        return LY_ESYS;
    }

    /* get timezone offset (do not use tm_gmtoff to avoid portability problems),
     * zonediff_h may be negative, zonediff_m MUST NOT */
    zonediff_s = ly_time_tz_offset_at(time);
    zonediff_h = zonediff_s / 60 / 60;
    zonediff_m = zonediff_s / 60 % 60;
    sprintf(zoneshift, "%+03d:%02d", zonediff_h, zonediff_m < 0 ? -zonediff_m : zonediff_m);

    /* print */
    if (asprintf(str, "%04d-%02d-%02dT%02d:%02d:%02d%s%s%s",
            tm.tm_year + 1900, tm.tm_mon + 1, tm.tm_mday, tm.tm_hour, tm.tm_min, tm.tm_sec,
            fractions_s ? "." : "", fractions_s ? fractions_s : "", zoneshift) == -1) {
        return LY_EMEM;
    }

    return LY_SUCCESS;
}